

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O0

response_ptr __thiscall
lsp::LanguageService::request_textDocument_references
          (LanguageService *this,Id *id,Parameter *params)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  response_ptr rVar1;
  elementNotFoundException *e;
  multipleDefinitionException *e_1;
  badUriException *e_2;
  undefined1 local_98 [8];
  vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> resVec;
  json result;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_50 [8];
  ReferenceParams p;
  Parameter *params_local;
  Id *id_local;
  
  p._40_8_ = params;
  (*(params->super_NullableEntity).super_Entity._vptr_Entity[3])();
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get<lsp::types::ReferenceParams,_lsp::types::ReferenceParams,_0>
            ((ReferenceParams *)local_50,&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&resVec.
                   super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  this_00 = std::__shared_ptr_access<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&xmlParser_);
  XmlParser::getReferences
            ((vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> *)local_98,this_00
             ,(ReferenceParams *)local_50);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  basic_json<std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>_&,_std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)&e_2,(vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> *)local_98
            );
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&resVec.
                  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&e_2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&e_2);
  std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::~vector
            ((vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> *)local_98);
  std::
  make_shared<jsonrpcpp::Response,jsonrpcpp::Id_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
            ((Id *)this,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)id);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&resVec.
                    super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  types::ReferenceParams::~ReferenceParams((ReferenceParams *)local_50);
  rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (response_ptr)rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

jsonrpcpp::response_ptr lsp::LanguageService::request_textDocument_references(const jsonrpcpp::Id &id, const jsonrpcpp::Parameter &params)
{
    lsp::types::ReferenceParams p = params.to_json().get<lsp::types::ReferenceParams>();
    json result;
    try
    {
        std::vector<lsp::types::Location> resVec = xmlParser_->getReferences(p);
        result = resVec;
    }
    catch (lsp::elementNotFoundException &e)
    {
        result = nullptr;
    }
    catch(lsp::multipleDefinitionException &e)
    {
        toClient_notification_telemetry_event_error(lsp::types::arxmlError::multipleDefinitions);
        result = nullptr;
    }
    catch(lsp::badUriException &e)
    {
        result = nullptr;
    }
    return std::make_shared<jsonrpcpp::Response>(id, result);
}